

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

cmGeneratorExpressionNode * cmGeneratorExpressionNode::GetNode(string *identifier)

{
  int iVar1;
  const_iterator cVar2;
  cmGeneratorExpressionNode *pcVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>
  __l;
  allocator_type local_157a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_1579;
  ShellPathNode *local_1578;
  DeviceLinkNode *local_1570;
  HostLinkNode *local_1568;
  LinkGroupNode *local_1560;
  LinkLibraryNode *local_1558;
  LinkLanguageNode *local_1550;
  LinkLanguageAndIdNode *local_1548;
  CompileLanguageNode *local_1540;
  CompileLanguageAndIdNode *local_1538;
  LinkOnlyNode *local_1530;
  CompileOnlyNode *local_1528;
  JoinNode *local_1520;
  InstallPrefixNode *local_1518;
  OneNode *local_1510;
  ZeroNode *local_1508;
  OneNode *local_1500;
  GenexEvalNode *local_14f8;
  TargetRuntimeDllDirsNode *local_14f0;
  TargetRuntimeDllsNode *local_14e8;
  TargetGenexEvalNode *local_14e0;
  TargetNameIfExistsNode *local_14d8;
  TargetExistsNode *local_14d0;
  TargetPolicyNode *local_14c8;
  TargetObjectsNode *local_14c0;
  TargetNameNode *local_14b8;
  TargetPropertyNode *local_14b0;
  CharacterNode<___> *local_14a8;
  CharacterNode<___> *local_14a0;
  CharacterNode<_,_> *local_1498;
  CharacterNode<_>_> *local_1490;
  IfNode *local_1488;
  BoolNode *local_1480;
  MakeCIdentifierNode *local_1478;
  PathEqualNode *local_1470;
  PathNode *local_1468;
  UpperCaseNode *local_1460;
  LowerCaseNode *local_1458;
  ListNode *local_1450;
  RemoveDuplicatesNode *local_1448;
  FilterNode *local_1440;
  InListNode *local_1438;
  EqualNode *local_1430;
  StrEqualNode *local_1428;
  TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag> *local_1420;
  TargetFilesystemArtifact<ArtifactBundleDirNameTag,_ArtifactNameTag> *local_1418;
  TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag> *local_1410;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag> *local_1408;
  TargetFilesystemArtifact<ArtifactSonameImportTag,_ArtifactDirTag> *local_1400;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag> *local_13f8;
  TargetFilesystemArtifact<ArtifactLinkerImportTag,_ArtifactDirTag> *local_13f0;
  TargetFilesystemArtifact<ArtifactLinkerLibraryTag,_ArtifactDirTag> *local_13e8;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag> *local_13e0;
  TargetFilesystemArtifact<ArtifactImportTag,_ArtifactDirTag> *local_13d8;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag> *local_13d0;
  TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag> *local_13c8;
  TargetFilesystemArtifact<ArtifactSonameImportTag,_ArtifactNameTag> *local_13c0;
  TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag> *local_13b8;
  TargetFilesystemArtifact<ArtifactLinkerImportTag,_ArtifactNameTag> *local_13b0;
  TargetFilesystemArtifact<ArtifactLinkerLibraryTag,_ArtifactNameTag> *local_13a8;
  TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag> *local_13a0;
  TargetFilesystemArtifact<ArtifactImportTag,_ArtifactNameTag> *local_1398;
  TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag> *local_1390;
  TargetFileArtifact<ArtifactLinkerImportFileSuffixTag> *local_1388;
  TargetFileArtifact<ArtifactLinkerLibraryFileSuffixTag> *local_1380;
  TargetFileArtifact<ArtifactLinkerFileSuffixTag> *local_1378;
  TargetFileArtifact<ArtifactImportFileSuffixTag> *local_1370;
  TargetFileArtifact<ArtifactFileSuffixTag> *local_1368;
  TargetFileArtifact<ArtifactLinkerImportFilePrefixTag> *local_1360;
  TargetFileArtifact<ArtifactLinkerLibraryFilePrefixTag> *local_1358;
  TargetFileArtifact<ArtifactLinkerFilePrefixTag> *local_1350;
  TargetFileArtifact<ArtifactImportFilePrefixTag> *local_1348;
  TargetFileArtifact<ArtifactFilePrefixTag> *local_1340;
  TargetFileBaseNameArtifact<ArtifactPdbTag> *local_1338;
  TargetFileBaseNameArtifact<ArtifactLinkerImportTag> *local_1330;
  TargetFileBaseNameArtifact<ArtifactLinkerLibraryTag> *local_1328;
  TargetFileBaseNameArtifact<ArtifactLinkerTag> *local_1320;
  TargetFileBaseNameArtifact<ArtifactImportTag> *local_1318;
  TargetFileBaseNameArtifact<ArtifactNameTag> *local_1310;
  TargetFilesystemArtifactNodeGroup<ArtifactPdbTag> *local_1308;
  TargetFilesystemArtifactNodeGroup<ArtifactSonameImportTag> *local_1300;
  TargetFilesystemArtifactNodeGroup<ArtifactSonameTag> *local_12f8;
  TargetFilesystemArtifactNodeGroup<ArtifactLinkerImportTag> *local_12f0;
  TargetFilesystemArtifactNodeGroup<ArtifactLinkerLibraryTag> *local_12e8;
  TargetFilesystemArtifactNodeGroup<ArtifactLinkerTag> *local_12e0;
  TargetFilesystemArtifactNodeGroup<ArtifactImportTag> *local_12d8;
  TargetFilesystemArtifactNodeGroup<ArtifactNameTag> *local_12d0;
  ConfigurationTestNode *local_12c8;
  ConfigurationNode *local_12c0;
  CompileFeaturesNode *local_12b8;
  PlatformIdNode *local_12b0;
  CompilerVersionNode *local_12a8;
  CompilerVersionNode *local_12a0;
  CompilerVersionNode *local_1298;
  CompilerVersionNode *local_1290;
  CompilerVersionNode *local_1288;
  CompilerVersionNode *local_1280;
  CompilerVersionNode *local_1278;
  VersionNode<(cmSystemTools::CompareOp)1> *local_1270;
  VersionNode<(cmSystemTools::CompareOp)3> *local_1268;
  VersionNode<(cmSystemTools::CompareOp)2> *local_1260;
  VersionNode<(cmSystemTools::CompareOp)5> *local_1258;
  VersionNode<(cmSystemTools::CompareOp)4> *local_1250;
  CompilerIdNode *local_1248;
  CompilerIdNode *local_1240;
  CompilerIdNode *local_1238;
  CompilerIdNode *local_1230;
  CompilerIdNode *local_1228;
  CompilerIdNode *local_1220;
  CompilerIdNode *local_1218;
  NotNode *local_1210;
  BooleanOpNode *local_1208;
  BooleanOpNode *local_1200;
  OneNode *local_11f8;
  ZeroNode *local_11f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_11e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_11c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1198;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1170;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1148;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_10f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_10d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_10a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1080;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1058;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1030;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1008;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_fe0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_fb8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_f90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_f68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_f40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_f18;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ef0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ec8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ea0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_e78;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_e50;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_e28;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_e00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_dd8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_db0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_d88;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_d60;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_d38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_d10;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ce8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_cc0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c48;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_c20;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_bf8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_bd0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ba8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b58;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b30;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ae0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_ab8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a40;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_a18;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_9a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_978;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_950;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_928;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_900;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_8b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_888;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_860;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_838;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_810;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_7c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_798;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_770;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_748;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_720;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_6a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_680;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_658;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_630;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_608;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_5b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_590;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_568;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_540;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_518;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_4a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_478;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_450;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_428;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_400;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3d8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_3b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_388;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_338;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_310;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_2c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_298;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_270;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_248;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1d0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_180;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_158;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_130;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_108;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
  local_40;
  
  if (GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    if (iVar1 != 0) {
      local_11f0 = &zeroNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_ZeroNode_*,_true>
                (&local_11e8,(char (*) [2])0x8b6ccc,&local_11f0);
      local_11f8 = &oneNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[2],_const_OneNode_*,_true>
                (&local_11c0,(char (*) [2])0x91b968,&local_11f8);
      local_1200 = &andNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_BooleanOpNode_*,_true>
                (&local_1198,(char (*) [4])0x8aa7cc,&local_1200);
      local_1208 = &orNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_BooleanOpNode_*,_true>
                (&local_1170,(char (*) [3])0x8f0e27,&local_1208);
      local_1210 = &notNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[4],_const_NotNode_*,_true>
                (&local_1148,(char (*) [4])0x8e6301,&local_1210);
      local_1218 = &cCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_CompilerIdNode_*,_true>
                (&local_1120,(char (*) [14])0x8d2f2f,&local_1218);
      local_1220 = &cxxCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_CompilerIdNode_*,_true>
                (&local_10f8,(char (*) [16])0x8d2f40,&local_1220);
      local_1228 = &objcCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompilerIdNode_*,_true>
                (&local_10d0,(char (*) [17])"OBJC_COMPILER_ID",&local_1228);
      local_1230 = &objcxxCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_CompilerIdNode_*,_true>
                (&local_10a8,(char (*) [19])"OBJCXX_COMPILER_ID",&local_1230);
      local_1238 = &cudaCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompilerIdNode_*,_true>
                (&local_1080,(char (*) [17])0x8a36cd,&local_1238);
      local_1240 = &fortranCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompilerIdNode_*,_true>
                (&local_1058,(char (*) [20])0x8cf5ee,&local_1240);
      local_1248 = &hipCompilerIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_CompilerIdNode_*,_true>
                (&local_1030,(char (*) [16])"HIP_COMPILER_ID",&local_1248);
      local_1250 = &versionGreaterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_VersionNode<(cmSystemTools::CompareOp)4>_*,_true>
                (&local_1008,(char (*) [16])"VERSION_GREATER",&local_1250);
      local_1258 = &versionGreaterEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_VersionNode<(cmSystemTools::CompareOp)5>_*,_true>
                (&local_fe0,(char (*) [22])"VERSION_GREATER_EQUAL",&local_1258);
      local_1260 = &versionLessNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[13],_const_VersionNode<(cmSystemTools::CompareOp)2>_*,_true>
                (&local_fb8,(char (*) [13])"VERSION_LESS",&local_1260);
      local_1268 = &versionLessEqNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_VersionNode<(cmSystemTools::CompareOp)3>_*,_true>
                (&local_f90,(char (*) [19])"VERSION_LESS_EQUAL",&local_1268);
      local_1270 = &versionEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_VersionNode<(cmSystemTools::CompareOp)1>_*,_true>
                (&local_f68,(char (*) [14])"VERSION_EQUAL",&local_1270);
      local_1278 = &cCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_CompilerVersionNode_*,_true>
                (&local_f40,(char (*) [19])0x8d2fb7,&local_1278);
      local_1280 = &cxxCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[21],_const_CompilerVersionNode_*,_true>
                (&local_f18,(char (*) [21])0x8d2fcd,&local_1280);
      local_1288 = &cudaCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_CompilerVersionNode_*,_true>
                (&local_ef0,(char (*) [22])0x8a36e4,&local_1288);
      local_1290 = &objcCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_CompilerVersionNode_*,_true>
                (&local_ec8,(char (*) [22])"OBJC_COMPILER_VERSION",&local_1290);
      local_1298 = &objcxxCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[24],_const_CompilerVersionNode_*,_true>
                (&local_ea0,(char (*) [24])"OBJCXX_COMPILER_VERSION",&local_1298);
      local_12a0 = &fortranCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[25],_const_CompilerVersionNode_*,_true>
                (&local_e78,(char (*) [25])"Fortran_COMPILER_VERSION",&local_12a0);
      local_12a8 = &hipCompilerVersionNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[21],_const_CompilerVersionNode_*,_true>
                (&local_e50,(char (*) [21])"HIP_COMPILER_VERSION",&local_12a8);
      local_12b0 = &platformIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_PlatformIdNode_*,_true>
                (&local_e28,(char (*) [12])"PLATFORM_ID",&local_12b0);
      local_12b8 = &compileFeaturesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileFeaturesNode_*,_true>
                (&local_e00,(char (*) [17])0x8cd0cb,&local_12b8);
      local_12c0 = &configurationNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_ConfigurationNode_*,_true>
                (&local_dd8,(char (*) [14])0x8837b8,&local_12c0);
      local_12c8 = &configurationTestNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_ConfigurationTestNode_*,_true>
                (&local_db0,(char (*) [7])0x8a3c81,&local_12c8);
      local_12d0 = &targetNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[12],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag>_*,_true>
                (&local_d88,(char (*) [12])0x8c30a0,
                 (TargetFilesystemArtifact<ArtifactNameTag,_ArtifactPathTag> **)&local_12d0);
      local_12d8 = &targetImportNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactImportTag,_ArtifactPathTag>_*,_true>
                (&local_d60,(char (*) [19])"TARGET_IMPORT_FILE",
                 (TargetFilesystemArtifact<ArtifactImportTag,_ArtifactPathTag> **)&local_12d8);
      local_12e0 = &targetLinkerNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag>_*,_true>
                (&local_d38,(char (*) [19])"TARGET_LINKER_FILE",
                 (TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactPathTag> **)&local_12e0);
      local_12e8 = &targetLinkerLibraryNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[27],_const_TargetFilesystemArtifact<ArtifactLinkerLibraryTag,_ArtifactPathTag>_*,_true>
                (&local_d10,(char (*) [27])"TARGET_LINKER_LIBRARY_FILE",
                 (TargetFilesystemArtifact<ArtifactLinkerLibraryTag,_ArtifactPathTag> **)&local_12e8
                );
      local_12f0 = &targetLinkerImportNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[26],_const_TargetFilesystemArtifact<ArtifactLinkerImportTag,_ArtifactPathTag>_*,_true>
                (&local_ce8,(char (*) [26])"TARGET_LINKER_IMPORT_FILE",
                 (TargetFilesystemArtifact<ArtifactLinkerImportTag,_ArtifactPathTag> **)&local_12f0)
      ;
      local_12f8 = &targetSoNameNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[19],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag>_*,_true>
                (&local_cc0,(char (*) [19])"TARGET_SONAME_FILE",
                 (TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactPathTag> **)&local_12f8);
      local_1300 = &targetSoNameImportNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[26],_const_TargetFilesystemArtifact<ArtifactSonameImportTag,_ArtifactPathTag>_*,_true>
                (&local_c98,(char (*) [26])"TARGET_SONAME_IMPORT_FILE",
                 (TargetFilesystemArtifact<ArtifactSonameImportTag,_ArtifactPathTag> **)&local_1300)
      ;
      local_1308 = &targetPdbNodeGroup;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag>_*,_true>
                (&local_c70,(char (*) [16])"TARGET_PDB_FILE",
                 (TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactPathTag> **)&local_1308);
      local_1310 = &targetFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetFileBaseNameArtifact<ArtifactNameTag>_*,_true>
                (&local_c48,(char (*) [22])"TARGET_FILE_BASE_NAME",&local_1310);
      local_1318 = &targetImportFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[29],_const_TargetFileBaseNameArtifact<ArtifactImportTag>_*,_true>
                (&local_c20,(char (*) [29])"TARGET_IMPORT_FILE_BASE_NAME",&local_1318);
      local_1320 = &targetLinkerFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[29],_const_TargetFileBaseNameArtifact<ArtifactLinkerTag>_*,_true>
                (&local_bf8,(char (*) [29])"TARGET_LINKER_FILE_BASE_NAME",&local_1320);
      local_1328 = &targetLinkerLibraryFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[37],_const_TargetFileBaseNameArtifact<ArtifactLinkerLibraryTag>_*,_true>
                (&local_bd0,(char (*) [37])"TARGET_LINKER_LIBRARY_FILE_BASE_NAME",&local_1328);
      local_1330 = &targetLinkerImportFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[36],_const_TargetFileBaseNameArtifact<ArtifactLinkerImportTag>_*,_true>
                (&local_ba8,(char (*) [36])"TARGET_LINKER_IMPORT_FILE_BASE_NAME",&local_1330);
      local_1338 = &targetPdbFileBaseNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileBaseNameArtifact<ArtifactPdbTag>_*,_true>
                (&local_b80,(char (*) [26])"TARGET_PDB_FILE_BASE_NAME",&local_1338);
      local_1340 = &targetFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFilePrefixTag>_*,_true>
                (&local_b58,(char (*) [19])"TARGET_FILE_PREFIX",&local_1340);
      local_1348 = &targetImportFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactImportFilePrefixTag>_*,_true>
                (&local_b30,(char (*) [26])"TARGET_IMPORT_FILE_PREFIX",&local_1348);
      local_1350 = &targetLinkerFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFilePrefixTag>_*,_true>
                (&local_b08,(char (*) [26])"TARGET_LINKER_FILE_PREFIX",&local_1350);
      local_1358 = &targetLinkerLibraryFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[34],_const_TargetFileArtifact<ArtifactLinkerLibraryFilePrefixTag>_*,_true>
                (&local_ae0,(char (*) [34])"TARGET_LINKER_LIBRARY_FILE_PREFIX",&local_1358);
      local_1360 = &targetLinkerImportFilePrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[33],_const_TargetFileArtifact<ArtifactLinkerImportFilePrefixTag>_*,_true>
                (&local_ab8,(char (*) [33])"TARGET_LINKER_IMPORT_FILE_PREFIX",&local_1360);
      local_1368 = &targetFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[19],_const_TargetFileArtifact<ArtifactFileSuffixTag>_*,_true>
                (&local_a90,(char (*) [19])"TARGET_FILE_SUFFIX",&local_1368);
      local_1370 = &targetImportFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactImportFileSuffixTag>_*,_true>
                (&local_a68,(char (*) [26])"TARGET_IMPORT_FILE_SUFFIX",&local_1370);
      local_1378 = &targetLinkerFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[26],_const_TargetFileArtifact<ArtifactLinkerFileSuffixTag>_*,_true>
                (&local_a40,(char (*) [26])"TARGET_LINKER_FILE_SUFFIX",&local_1378);
      local_1380 = &targetLinkerLibraryFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[34],_const_TargetFileArtifact<ArtifactLinkerLibraryFileSuffixTag>_*,_true>
                (&local_a18,(char (*) [34])"TARGET_LINKER_LIBRARY_FILE_SUFFIX",&local_1380);
      local_1388 = &targetLinkerImportFileSuffixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[33],_const_TargetFileArtifact<ArtifactLinkerImportFileSuffixTag>_*,_true>
                (&local_9f0,(char (*) [33])"TARGET_LINKER_IMPORT_FILE_SUFFIX",&local_1388);
      local_1390 = &targetNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[17],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactNameTag>_*,_true>
                (&local_9c8,(char (*) [17])"TARGET_FILE_NAME",&local_1390);
      local_1398 = &targetImportNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactImportTag,_ArtifactNameTag>_*,_true>
                (&local_9a0,(char (*) [24])"TARGET_IMPORT_FILE_NAME",&local_1398);
      local_13a0 = &targetLinkerNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactNameTag>_*,_true>
                (&local_978,(char (*) [24])"TARGET_LINKER_FILE_NAME",&local_13a0);
      local_13a8 = &targetLinkerLibraryNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[32],_const_TargetFilesystemArtifact<ArtifactLinkerLibraryTag,_ArtifactNameTag>_*,_true>
                (&local_950,(char (*) [32])"TARGET_LINKER_LIBRARY_FILE_NAME",&local_13a8);
      local_13b0 = &targetLinkerImportNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[31],_const_TargetFilesystemArtifact<ArtifactLinkerImportTag,_ArtifactNameTag>_*,_true>
                (&local_928,(char (*) [31])"TARGET_LINKER_IMPORT_FILE_NAME",&local_13b0);
      local_13b8 = &targetSoNameNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[24],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactNameTag>_*,_true>
                (&local_900,(char (*) [24])"TARGET_SONAME_FILE_NAME",&local_13b8);
      local_13c0 = &targetSoNameImportNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[31],_const_TargetFilesystemArtifact<ArtifactSonameImportTag,_ArtifactNameTag>_*,_true>
                (&local_8d8,(char (*) [31])"TARGET_SONAME_IMPORT_FILE_NAME",&local_13c0);
      local_13c8 = &targetPdbNodeGroup.FileName;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[21],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactNameTag>_*,_true>
                (&local_8b0,(char (*) [21])"TARGET_PDB_FILE_NAME",&local_13c8);
      local_13d0 = &targetNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[16],_const_TargetFilesystemArtifact<ArtifactNameTag,_ArtifactDirTag>_*,_true>
                (&local_888,(char (*) [16])"TARGET_FILE_DIR",&local_13d0);
      local_13d8 = &targetImportNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactImportTag,_ArtifactDirTag>_*,_true>
                (&local_860,(char (*) [23])"TARGET_IMPORT_FILE_DIR",&local_13d8);
      local_13e0 = &targetLinkerNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactLinkerTag,_ArtifactDirTag>_*,_true>
                (&local_838,(char (*) [23])"TARGET_LINKER_FILE_DIR",&local_13e0);
      local_13e8 = &targetLinkerLibraryNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[31],_const_TargetFilesystemArtifact<ArtifactLinkerLibraryTag,_ArtifactDirTag>_*,_true>
                (&local_810,(char (*) [31])"TARGET_LINKER_LIBRARY_FILE_DIR",&local_13e8);
      local_13f0 = &targetLinkerImportNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[30],_const_TargetFilesystemArtifact<ArtifactLinkerImportTag,_ArtifactDirTag>_*,_true>
                (&local_7e8,(char (*) [30])"TARGET_LINKER_IMPORT_FILE_DIR",&local_13f0);
      local_13f8 = &targetSoNameNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactSonameTag,_ArtifactDirTag>_*,_true>
                (&local_7c0,(char (*) [23])"TARGET_SONAME_FILE_DIR",&local_13f8);
      local_1400 = &targetSoNameImportNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[30],_const_TargetFilesystemArtifact<ArtifactSonameImportTag,_ArtifactDirTag>_*,_true>
                (&local_798,(char (*) [30])"TARGET_SONAME_IMPORT_FILE_DIR",&local_1400);
      local_1408 = &targetPdbNodeGroup.FileDir;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[20],_const_TargetFilesystemArtifact<ArtifactPdbTag,_ArtifactDirTag>_*,_true>
                (&local_770,(char (*) [20])"TARGET_PDB_FILE_DIR",&local_1408);
      local_1410 = &targetBundleDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[18],_const_TargetFilesystemArtifact<ArtifactBundleDirTag,_ArtifactPathTag>_*,_true>
                (&local_748,(char (*) [18])"TARGET_BUNDLE_DIR",&local_1410);
      local_1418 = &targetBundleDirNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[23],_const_TargetFilesystemArtifact<ArtifactBundleDirNameTag,_ArtifactNameTag>_*,_true>
                (&local_720,(char (*) [23])"TARGET_BUNDLE_DIR_NAME",&local_1418);
      local_1420 = &targetBundleContentDirNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::
      pair<const_char_(&)[26],_const_TargetFilesystemArtifact<ArtifactBundleContentDirTag,_ArtifactPathTag>_*,_true>
                (&local_6f8,(char (*) [26])"TARGET_BUNDLE_CONTENT_DIR",&local_1420);
      local_1428 = &strEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[9],_const_StrEqualNode_*,_true>
                (&local_6d0,(char (*) [9])"STREQUAL",&local_1428);
      local_1430 = &equalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_EqualNode_*,_true>
                (&local_6a8,(char (*) [6])0x8bd894,&local_1430);
      local_1438 = &inListNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_InListNode_*,_true>
                (&local_680,(char (*) [8])"IN_LIST",&local_1438);
      local_1440 = &filterNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[7],_const_FilterNode_*,_true>
                (&local_658,(char (*) [7])"FILTER",&local_1440);
      local_1448 = &removeDuplicatesNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_RemoveDuplicatesNode_*,_true>
                (&local_630,(char (*) [18])"REMOVE_DUPLICATES",&local_1448);
      local_1450 = &listNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_ListNode_*,_true>
                (&local_608,(char (*) [5])0x8ba15e,&local_1450);
      local_1458 = &lowerCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_LowerCaseNode_*,_true>
                (&local_5e0,(char (*) [11])"LOWER_CASE",&local_1458);
      local_1460 = &upperCaseNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_UpperCaseNode_*,_true>
                (&local_5b8,(char (*) [11])"UPPER_CASE",&local_1460);
      local_1468 = &pathNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_PathNode_*,_true>
                (&local_590,(char (*) [5])0x8d024c,&local_1468);
      local_1470 = &pathEqualNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_PathEqualNode_*,_true>
                (&local_568,(char (*) [11])"PATH_EQUAL",&local_1470);
      local_1478 = &makeCIdentifierNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_MakeCIdentifierNode_*,_true>
                (&local_540,(char (*) [18])"MAKE_C_IDENTIFIER",&local_1478);
      local_1480 = &boolNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_BoolNode_*,_true>
                (&local_518,(char (*) [5])0x8cd811,&local_1480);
      local_1488 = &ifNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[3],_const_IfNode_*,_true>(&local_4f0,(char (*) [3])0x8c8a6a,&local_1488)
      ;
      local_1490 = &angle_rNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[8],_const_CharacterNode<_>_>____true>
                (&local_4c8,(char (*) [8])"ANGLE-R",&local_1490);
      local_1498 = &commaNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_CharacterNode<_,_>_*,_true>
                (&local_4a0,(char (*) [6])"COMMA",&local_1498);
      local_14a0 = &semicolonNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_CharacterNode<___>_*,_true>
                (&local_478,(char (*) [10])"SEMICOLON",&local_14a0);
      local_14a8 = &quoteNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[6],_const_CharacterNode<___>_*,_true>
                (&local_450,(char (*) [6])0x8c32b7,&local_14a8);
      local_14b0 = &targetPropertyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_TargetPropertyNode_*,_true>
                (&local_428,(char (*) [16])"TARGET_PROPERTY",&local_14b0);
      local_14b8 = &targetNameNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_const_TargetNameNode_*,_true>
                (&local_400,(char (*) [12])0x89c99b,&local_14b8);
      local_14c0 = &targetObjectsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_TargetObjectsNode_*,_true>
                (&local_3d8,(char (*) [15])"TARGET_OBJECTS",&local_14c0);
      local_14c8 = &targetPolicyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetPolicyNode_*,_true>
                (&local_3b0,(char (*) [14])"TARGET_POLICY",&local_14c8);
      local_14d0 = &targetExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_TargetExistsNode_*,_true>
                (&local_388,(char (*) [14])"TARGET_EXISTS",&local_14d0);
      local_14d8 = &targetNameIfExistsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_TargetNameIfExistsNode_*,_true>
                (&local_360,(char (*) [22])"TARGET_NAME_IF_EXISTS",&local_14d8);
      local_14e0 = &targetGenexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_TargetGenexEvalNode_*,_true>
                (&local_338,(char (*) [18])"TARGET_GENEX_EVAL",&local_14e0);
      local_14e8 = &targetRuntimeDllsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_TargetRuntimeDllsNode_*,_true>
                (&local_310,(char (*) [20])"TARGET_RUNTIME_DLLS",&local_14e8);
      local_14f0 = &targetRuntimeDllDirsNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[24],_const_TargetRuntimeDllDirsNode_*,_true>
                (&local_2e8,(char (*) [24])"TARGET_RUNTIME_DLL_DIRS",&local_14f0);
      local_14f8 = &genexEvalNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_GenexEvalNode_*,_true>
                (&local_2c0,(char (*) [11])0x8d34ea,&local_14f8);
      local_1500 = &buildInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[16],_const_OneNode_*,_true>
                (&local_298,(char (*) [16])"BUILD_INTERFACE",&local_1500);
      local_1508 = &installInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[18],_const_ZeroNode_*,_true>
                (&local_270,(char (*) [18])"INSTALL_INTERFACE",&local_1508);
      local_1510 = &buildLocalInterfaceNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[22],_const_OneNode_*,_true>
                (&local_248,(char (*) [22])"BUILD_LOCAL_INTERFACE",&local_1510);
      local_1518 = &installPrefixNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[15],_const_InstallPrefixNode_*,_true>
                (&local_220,(char (*) [15])0x8e4e50,&local_1518);
      local_1520 = &joinNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[5],_const_JoinNode_*,_true>(&local_1f8,(char (*) [5])"JOIN",&local_1520)
      ;
      local_1528 = &compileOnlyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[13],_const_CompileOnlyNode_*,_true>
                (&local_1d0,(char (*) [13])"COMPILE_ONLY",&local_1528);
      local_1530 = &linkOnlyNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_LinkOnlyNode_*,_true>
                (&local_1a8,(char (*) [10])0x8b9ddc,&local_1530);
      local_1538 = &languageAndIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[20],_const_CompileLanguageAndIdNode_*,_true>
                (&local_180,(char (*) [20])"COMPILE_LANG_AND_ID",&local_1538);
      local_1540 = &languageNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_CompileLanguageNode_*,_true>
                (&local_158,(char (*) [17])"COMPILE_LANGUAGE",&local_1540);
      local_1548 = &linkLanguageAndIdNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[17],_const_LinkLanguageAndIdNode_*,_true>
                (&local_130,(char (*) [17])"LINK_LANG_AND_ID",&local_1548);
      local_1550 = &linkLanguageNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[14],_const_LinkLanguageNode_*,_true>
                (&local_108,(char (*) [14])"LINK_LANGUAGE",&local_1550);
      local_1558 = &linkLibraryNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[13],_const_LinkLibraryNode_*,_true>
                (&local_e0,(char (*) [13])0x8c2eba,&local_1558);
      local_1560 = &linkGroupNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_LinkGroupNode_*,_true>
                (&local_b8,(char (*) [11])0x8d45e3,&local_1560);
      local_1568 = &hostLinkNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[10],_const_HostLinkNode_*,_true>
                (&local_90,(char (*) [10])"HOST_LINK",&local_1568);
      local_1570 = &deviceLinkNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[12],_const_DeviceLinkNode_*,_true>
                (&local_68,(char (*) [12])"DEVICE_LINK",&local_1570);
      local_1578 = &shellPathNode;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>
      ::pair<const_char_(&)[11],_const_ShellPathNode_*,_true>
                (&local_40,(char (*) [11])"SHELL_PATH",&local_1578);
      __l._M_len = 0x72;
      __l._M_array = &local_11e8;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
      ::map(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,__l,&local_1579,&local_157a);
      lVar4 = -0x11d0;
      paVar5 = &local_40.first.field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + -5);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
                   ::~map,&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmGeneratorExpressionNode_*>_>_>
          ::find(&GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t,identifier);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &GetNode(std::__cxx11::string_const&)::nodeMap_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)
  {
    pcVar3 = (cmGeneratorExpressionNode *)0x0;
  }
  else {
    pcVar3 = *(cmGeneratorExpressionNode **)(cVar2._M_node + 2);
  }
  return pcVar3;
}

Assistant:

const cmGeneratorExpressionNode* cmGeneratorExpressionNode::GetNode(
  const std::string& identifier)
{
  static std::map<std::string, cmGeneratorExpressionNode const*> const nodeMap{
    { "0", &zeroNode },
    { "1", &oneNode },
    { "AND", &andNode },
    { "OR", &orNode },
    { "NOT", &notNode },
    { "C_COMPILER_ID", &cCompilerIdNode },
    { "CXX_COMPILER_ID", &cxxCompilerIdNode },
    { "OBJC_COMPILER_ID", &objcCompilerIdNode },
    { "OBJCXX_COMPILER_ID", &objcxxCompilerIdNode },
    { "CUDA_COMPILER_ID", &cudaCompilerIdNode },
    { "Fortran_COMPILER_ID", &fortranCompilerIdNode },
    { "HIP_COMPILER_ID", &hipCompilerIdNode },
    { "VERSION_GREATER", &versionGreaterNode },
    { "VERSION_GREATER_EQUAL", &versionGreaterEqNode },
    { "VERSION_LESS", &versionLessNode },
    { "VERSION_LESS_EQUAL", &versionLessEqNode },
    { "VERSION_EQUAL", &versionEqualNode },
    { "C_COMPILER_VERSION", &cCompilerVersionNode },
    { "CXX_COMPILER_VERSION", &cxxCompilerVersionNode },
    { "CUDA_COMPILER_VERSION", &cudaCompilerVersionNode },
    { "OBJC_COMPILER_VERSION", &objcCompilerVersionNode },
    { "OBJCXX_COMPILER_VERSION", &objcxxCompilerVersionNode },
    { "Fortran_COMPILER_VERSION", &fortranCompilerVersionNode },
    { "HIP_COMPILER_VERSION", &hipCompilerVersionNode },
    { "PLATFORM_ID", &platformIdNode },
    { "COMPILE_FEATURES", &compileFeaturesNode },
    { "CONFIGURATION", &configurationNode },
    { "CONFIG", &configurationTestNode },
    { "TARGET_FILE", &targetNodeGroup.File },
    { "TARGET_IMPORT_FILE", &targetImportNodeGroup.File },
    { "TARGET_LINKER_FILE", &targetLinkerNodeGroup.File },
    { "TARGET_LINKER_LIBRARY_FILE", &targetLinkerLibraryNodeGroup.File },
    { "TARGET_LINKER_IMPORT_FILE", &targetLinkerImportNodeGroup.File },
    { "TARGET_SONAME_FILE", &targetSoNameNodeGroup.File },
    { "TARGET_SONAME_IMPORT_FILE", &targetSoNameImportNodeGroup.File },
    { "TARGET_PDB_FILE", &targetPdbNodeGroup.File },
    { "TARGET_FILE_BASE_NAME", &targetFileBaseNameNode },
    { "TARGET_IMPORT_FILE_BASE_NAME", &targetImportFileBaseNameNode },
    { "TARGET_LINKER_FILE_BASE_NAME", &targetLinkerFileBaseNameNode },
    { "TARGET_LINKER_LIBRARY_FILE_BASE_NAME",
      &targetLinkerLibraryFileBaseNameNode },
    { "TARGET_LINKER_IMPORT_FILE_BASE_NAME",
      &targetLinkerImportFileBaseNameNode },
    { "TARGET_PDB_FILE_BASE_NAME", &targetPdbFileBaseNameNode },
    { "TARGET_FILE_PREFIX", &targetFilePrefixNode },
    { "TARGET_IMPORT_FILE_PREFIX", &targetImportFilePrefixNode },
    { "TARGET_LINKER_FILE_PREFIX", &targetLinkerFilePrefixNode },
    { "TARGET_LINKER_LIBRARY_FILE_PREFIX",
      &targetLinkerLibraryFilePrefixNode },
    { "TARGET_LINKER_IMPORT_FILE_PREFIX", &targetLinkerImportFilePrefixNode },
    { "TARGET_FILE_SUFFIX", &targetFileSuffixNode },
    { "TARGET_IMPORT_FILE_SUFFIX", &targetImportFileSuffixNode },
    { "TARGET_LINKER_FILE_SUFFIX", &targetLinkerFileSuffixNode },
    { "TARGET_LINKER_LIBRARY_FILE_SUFFIX",
      &targetLinkerLibraryFileSuffixNode },
    { "TARGET_LINKER_IMPORT_FILE_SUFFIX", &targetLinkerImportFileSuffixNode },
    { "TARGET_FILE_NAME", &targetNodeGroup.FileName },
    { "TARGET_IMPORT_FILE_NAME", &targetImportNodeGroup.FileName },
    { "TARGET_LINKER_FILE_NAME", &targetLinkerNodeGroup.FileName },
    { "TARGET_LINKER_LIBRARY_FILE_NAME",
      &targetLinkerLibraryNodeGroup.FileName },
    { "TARGET_LINKER_IMPORT_FILE_NAME",
      &targetLinkerImportNodeGroup.FileName },
    { "TARGET_SONAME_FILE_NAME", &targetSoNameNodeGroup.FileName },
    { "TARGET_SONAME_IMPORT_FILE_NAME",
      &targetSoNameImportNodeGroup.FileName },
    { "TARGET_PDB_FILE_NAME", &targetPdbNodeGroup.FileName },
    { "TARGET_FILE_DIR", &targetNodeGroup.FileDir },
    { "TARGET_IMPORT_FILE_DIR", &targetImportNodeGroup.FileDir },
    { "TARGET_LINKER_FILE_DIR", &targetLinkerNodeGroup.FileDir },
    { "TARGET_LINKER_LIBRARY_FILE_DIR",
      &targetLinkerLibraryNodeGroup.FileDir },
    { "TARGET_LINKER_IMPORT_FILE_DIR", &targetLinkerImportNodeGroup.FileDir },
    { "TARGET_SONAME_FILE_DIR", &targetSoNameNodeGroup.FileDir },
    { "TARGET_SONAME_IMPORT_FILE_DIR", &targetSoNameImportNodeGroup.FileDir },
    { "TARGET_PDB_FILE_DIR", &targetPdbNodeGroup.FileDir },
    { "TARGET_BUNDLE_DIR", &targetBundleDirNode },
    { "TARGET_BUNDLE_DIR_NAME", &targetBundleDirNameNode },
    { "TARGET_BUNDLE_CONTENT_DIR", &targetBundleContentDirNode },
    { "STREQUAL", &strEqualNode },
    { "EQUAL", &equalNode },
    { "IN_LIST", &inListNode },
    { "FILTER", &filterNode },
    { "REMOVE_DUPLICATES", &removeDuplicatesNode },
    { "LIST", &listNode },
    { "LOWER_CASE", &lowerCaseNode },
    { "UPPER_CASE", &upperCaseNode },
    { "PATH", &pathNode },
    { "PATH_EQUAL", &pathEqualNode },
    { "MAKE_C_IDENTIFIER", &makeCIdentifierNode },
    { "BOOL", &boolNode },
    { "IF", &ifNode },
    { "ANGLE-R", &angle_rNode },
    { "COMMA", &commaNode },
    { "SEMICOLON", &semicolonNode },
    { "QUOTE", &quoteNode },
    { "TARGET_PROPERTY", &targetPropertyNode },
    { "TARGET_NAME", &targetNameNode },
    { "TARGET_OBJECTS", &targetObjectsNode },
    { "TARGET_POLICY", &targetPolicyNode },
    { "TARGET_EXISTS", &targetExistsNode },
    { "TARGET_NAME_IF_EXISTS", &targetNameIfExistsNode },
    { "TARGET_GENEX_EVAL", &targetGenexEvalNode },
    { "TARGET_RUNTIME_DLLS", &targetRuntimeDllsNode },
    { "TARGET_RUNTIME_DLL_DIRS", &targetRuntimeDllDirsNode },
    { "GENEX_EVAL", &genexEvalNode },
    { "BUILD_INTERFACE", &buildInterfaceNode },
    { "INSTALL_INTERFACE", &installInterfaceNode },
    { "BUILD_LOCAL_INTERFACE", &buildLocalInterfaceNode },
    { "INSTALL_PREFIX", &installPrefixNode },
    { "JOIN", &joinNode },
    { "COMPILE_ONLY", &compileOnlyNode },
    { "LINK_ONLY", &linkOnlyNode },
    { "COMPILE_LANG_AND_ID", &languageAndIdNode },
    { "COMPILE_LANGUAGE", &languageNode },
    { "LINK_LANG_AND_ID", &linkLanguageAndIdNode },
    { "LINK_LANGUAGE", &linkLanguageNode },
    { "LINK_LIBRARY", &linkLibraryNode },
    { "LINK_GROUP", &linkGroupNode },
    { "HOST_LINK", &hostLinkNode },
    { "DEVICE_LINK", &deviceLinkNode },
    { "SHELL_PATH", &shellPathNode }
  };

  {
    auto itr = nodeMap.find(identifier);
    if (itr != nodeMap.end()) {
      return itr->second;
    }
  }
  return nullptr;
}